

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O3

void asm_snap_alloc1(ASMState *as,IRRef ref)

{
  ushort uVar1;
  IRIns *pIVar2;
  byte bVar3;
  Reg RVar4;
  IRIns *pIVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  IRIns *pIVar9;
  uint uVar10;
  IRIns *ir;
  
  if (ref < 0x8000) {
    return;
  }
  pIVar5 = as->ir;
  uVar8 = (ulong)ref;
  ir = pIVar5 + uVar8;
  do {
    if ((ir->field_1).r == 0xfd) {
      return;
    }
    as->snapfilt1 = as->snapfilt1 | 1L << ((byte)uVar8 & 0x3f);
    uVar7 = ref + 0xfb3ee249;
    uVar10 = (uVar7 ^ ref) - (uVar7 * 0x4000 | uVar7 >> 0x12);
    as->snapfilt2 =
         as->snapfilt2 |
         1L << (((byte)(uVar7 >> 0xd) ^ (byte)uVar10) - (char)(uVar10 >> 0x13) & 0x3f);
    if (-1 < (char)(ir->field_1).r) {
      return;
    }
    if ((ir->field_1).s != '\0') {
      return;
    }
    if ((ir->field_1).r == 0xfe) {
      (ir->field_1).r = 0xfd;
      if ((ir->field_1).o != 'T') {
        pIVar5 = as->ir + (as->snapref - 1);
        break;
      }
      ir = (IRIns *)&(ir->field_0).op2;
      pIVar5 = as->ir;
    }
    else {
      if (((ir->field_1).o != '[') || ((ir->field_0).op2 != 0x1d3)) {
LAB_0013cb72:
        bVar3 = ((ir->field_1).t.irt & 0x1f) - 0xd;
        uVar7 = 0xbfef;
        if (bVar3 < 2) {
          uVar7 = 0xffff0000;
        }
        if ((as->freeset & uVar7) != 0) goto LAB_0013cb91;
        if (bVar3 < 2) {
          lVar6 = 0;
          do {
            if ((*(byte *)((long)as->cost + lVar6 * 4 + 0x41) & 0x80) == 0) {
LAB_0013cb91:
              RVar4 = ra_allocref(as,ref,uVar7);
              if (((ir->field_1).t.irt & 0x40) == 0) {
                as->weakset = as->weakset | 1 << ((byte)RVar4 & 0x1f);
              }
              if (as->mclim <= as->mcp) {
                return;
              }
              asm_mclimit(as);
            }
            lVar6 = lVar6 + 1;
          } while (lVar6 != 0x10);
        }
        ra_spill(as,ir);
        return;
      }
      for (pIVar9 = pIVar5 + as->curins; ir < pIVar9; pIVar9 = pIVar9 + -1) {
        if (((ref == (pIVar9->field_0).op1) || (ref == (pIVar9->field_0).op2)) &&
           (1 < (byte)((pIVar9->field_1).r + 3))) goto LAB_0013cb72;
      }
    }
    uVar1 = (ir->field_0).op1;
    uVar8 = (ulong)uVar1;
    ir = pIVar5 + uVar8;
    ref = (IRRef)uVar1;
    if (-1 < (short)uVar1) {
      return;
    }
  } while( true );
LAB_0013cc04:
  if (pIVar5 <= ir) {
    return;
  }
  if ((pIVar5->field_1).r == 0xfe) {
    if ((ulong)(pIVar5->field_1).s == 0xff) {
      uVar7 = (pIVar5->field_1).o - 0x4a;
      if ((uVar7 < 5) && (uVar7 != 2)) {
        pIVar2 = as->ir;
        pIVar9 = pIVar2 + (pIVar5->field_0).op1;
        if (((pIVar9->field_1).o & 0xfe) == 0x38) {
          pIVar9 = pIVar2 + (pIVar9->field_0).op1;
        }
        if (pIVar2 + (pIVar9->field_0).op1 == ir) goto LAB_0013cc67;
      }
    }
    else if (pIVar5 == ir + (pIVar5->field_1).s) {
LAB_0013cc67:
      asm_snap_alloc1(as,(uint)(pIVar5->field_0).op2);
    }
  }
  pIVar5 = pIVar5 + -1;
  goto LAB_0013cc04;
}

Assistant:

static void asm_snap_alloc1(ASMState *as, IRRef ref)
{
  IRIns *ir = IR(ref);
  if (!irref_isk(ref) && ir->r != RID_SUNK) {
    bloomset(as->snapfilt1, ref);
    bloomset(as->snapfilt2, hashrot(ref, ref + HASH_BIAS));
    if (ra_used(ir)) return;
    if (ir->r == RID_SINK) {
      ir->r = RID_SUNK;
#if LJ_HASFFI
      if (ir->o == IR_CNEWI) {  /* Allocate CNEWI value. */
	asm_snap_alloc1(as, ir->op2);
	if (LJ_32 && (ir+1)->o == IR_HIOP)
	  asm_snap_alloc1(as, (ir+1)->op2);
      } else
#endif
      {  /* Allocate stored values for TNEW, TDUP and CNEW. */
	IRIns *irs;
	lj_assertA(ir->o == IR_TNEW || ir->o == IR_TDUP || ir->o == IR_CNEW,
		   "sink of IR %04d has bad op %d", ref - REF_BIAS, ir->o);
	for (irs = IR(as->snapref-1); irs > ir; irs--)
	  if (irs->r == RID_SINK && asm_sunk_store(as, ir, irs)) {
	    lj_assertA(irs->o == IR_ASTORE || irs->o == IR_HSTORE ||
		       irs->o == IR_FSTORE || irs->o == IR_XSTORE,
		       "sunk store IR %04d has bad op %d",
		       (int)(irs - as->ir) - REF_BIAS, irs->o);
	    asm_snap_alloc1(as, irs->op2);
	    if (LJ_32 && (irs+1)->o == IR_HIOP)
	      asm_snap_alloc1(as, (irs+1)->op2);
	  }
      }
    } else {
      RegSet allow;
      if (ir->o == IR_CONV && ir->op2 == IRCONV_NUM_INT) {
	IRIns *irc;
	for (irc = IR(as->curins); irc > ir; irc--)
	  if ((irc->op1 == ref || irc->op2 == ref) &&
	      !(irc->r == RID_SINK || irc->r == RID_SUNK))
	    goto nosink;  /* Don't sink conversion if result is used. */
	asm_snap_alloc1(as, ir->op1);
	return;
      }
    nosink:
      allow = (!LJ_SOFTFP && irt_isfp(ir->t)) ? RSET_FPR : RSET_GPR;
      if ((as->freeset & allow) ||
	       (allow == RSET_FPR && asm_snap_canremat(as))) {
	/* Get a weak register if we have a free one or can rematerialize. */
	Reg r = ra_allocref(as, ref, allow);  /* Allocate a register. */
	if (!irt_isphi(ir->t))
	  ra_weak(as, r);  /* But mark it as weakly referenced. */
	checkmclim(as);
	RA_DBGX((as, "snapreg   $f $r", ref, ir->r));
      } else {
	ra_spill(as, ir);  /* Otherwise force a spill slot. */
	RA_DBGX((as, "snapspill $f $s", ref, ir->s));
      }
    }
  }
}